

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareDwa.cpp
# Opt level: O3

half toNonlinear(half linear)

{
  float fVar1;
  char cVar2;
  ushort uVar3;
  float fVar4;
  uint uVar5;
  float fVar6;
  
  fVar1 = *(float *)(_imath_half_to_float_table + (ulong)linear._h * 4);
  if ((~linear._h & 0x7c00) == 0) {
    uVar3 = 0;
  }
  else {
    fVar6 = ABS(fVar1);
    fVar1 = *(float *)(&DAT_001bc190 + (ulong)(fVar1 < 0.0) * 4);
    if (fVar6 <= 1.0) {
      fVar6 = powf(fVar6,0.45454544);
    }
    else {
      fVar6 = logf(fVar6);
      fVar6 = fVar6 / 2.2 + 1.0;
    }
    fVar4 = ABS(fVar1 * fVar6);
    uVar3 = (ushort)((uint)(fVar1 * fVar6) >> 0x10) & 0x8000;
    if ((uint)fVar4 < 0x38800000) {
      if ((0x33000000 < (uint)fVar4) &&
         (uVar5 = (uint)fVar4 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar4 >> 0x17),
         uVar3 = uVar3 | (ushort)(uVar5 >> (0x7eU - cVar2 & 0x1f)),
         0x80000000 < uVar5 << (cVar2 + 0xa2U & 0x1f))) {
        uVar3 = uVar3 + 1;
      }
    }
    else if ((uint)fVar4 < 0x7f800000) {
      if ((uint)fVar4 < 0x477ff000) {
        uVar3 = (ushort)((int)fVar4 + 0x8000fff + (uint)(((uint)fVar4 >> 0xd & 1) != 0) >> 0xd) |
                uVar3;
      }
      else {
        uVar3 = uVar3 | 0x7c00;
      }
    }
    else {
      uVar3 = uVar3 | 0x7c00;
      if (fVar4 != INFINITY) {
        uVar5 = (uint)fVar4 >> 0xd & 0x3ff;
        uVar3 = uVar3 | (ushort)uVar5 | (ushort)(uVar5 == 0);
      }
    }
  }
  return (half)uVar3;
}

Assistant:

half
toNonlinear (half linear)
{
    float sign    = 1;
    float logBase = pow (2.7182818, 2.2);

    if ((float) linear < 0) { sign = -1; }

    if ((linear.bits () & 0x7c00) == 0x7c00) { return (half) 0.0; }

    if (fabs ((float) linear) <= 1.0f)
    {
        return (half) (sign * pow (fabs ((float) linear), 1.f / 2.2f));
    }

    return (half) (sign * (log (fabs ((float) linear)) / log (logBase) + 1.0f));
}